

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDPPolicyIteration.cpp
# Opt level: O2

QTable * __thiscall
MDPPolicyIteration::GetQTable
          (QTable *__return_storage_ptr__,MDPPolicyIteration *this,Index time_step)

{
  const_reference a;
  
  a = std::vector<QTable,_std::allocator<QTable>_>::at(&this->_m_QValues,(ulong)time_step);
  QTable::QTable(__return_storage_ptr__,a);
  return __return_storage_ptr__;
}

Assistant:

QTable MDPPolicyIteration::GetQTable(Index time_step) const
{
    return(_m_QValues.at(time_step));
}